

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void do_revertframes(compiler_common *common)

{
  sljit_compiler *compiler_00;
  sljit_s32 sVar1;
  sljit_label *label;
  sljit_jump *psVar2;
  sljit_jump *jump_00;
  sljit_label *psVar3;
  sljit_label *mainloop;
  sljit_jump *jump;
  sljit_compiler *compiler;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  sljit_emit_fast_enter(compiler_00,5,0);
  sljit_get_local_base(compiler_00,1,0,0);
  label = sljit_emit_label(compiler_00);
  sljit_emit_op1(compiler_00,0x20,4,0,0x8c,-8);
  psVar2 = sljit_emit_cmp(compiler_00,9,4,0,0x40,0);
  sljit_emit_op2(compiler_00,0x60,4,0,4,0,1,0);
  sVar1 = sljit_get_register_index(3);
  if (sVar1 < 0) {
    sljit_emit_op1(compiler_00,0x20,0x84,0,0x8c,-0x10);
    sljit_emit_op1(compiler_00,0x20,0x84,8,0x8c,-0x18);
    sljit_emit_op2(compiler_00,0x62,0xc,0,0xc,0,0x40,0x18);
  }
  else {
    sljit_emit_op1(compiler_00,0x20,1,0,0x8c,-0x10);
    sljit_emit_op1(compiler_00,0x20,3,0,0x8c,-0x18);
    sljit_emit_op2(compiler_00,0x62,0xc,0,0xc,0,0x40,0x18);
    sljit_emit_op1(compiler_00,0x20,0x84,0,1,0);
    sljit_get_local_base(compiler_00,1,0,0);
    sljit_emit_op1(compiler_00,0x20,0x84,8,3,0);
  }
  jump_00 = sljit_emit_jump(compiler_00,0x18);
  sljit_set_label(jump_00,label);
  psVar3 = sljit_emit_label(compiler_00);
  sljit_set_label(psVar2,psVar3);
  psVar2 = sljit_emit_cmp(compiler_00,1,4,0,0x40,0);
  sljit_emit_fast_return(compiler_00,5,0);
  psVar3 = sljit_emit_label(compiler_00);
  sljit_set_label(psVar2,psVar3);
  sljit_emit_op1(compiler_00,0x29,4,0,4,0);
  sljit_emit_op2(compiler_00,0x60,4,0,4,0,1,0);
  sVar1 = sljit_get_register_index(3);
  if (sVar1 < 0) {
    sljit_emit_op1(compiler_00,0x20,0x84,0,0x8c,-0x10);
    sljit_emit_op2(compiler_00,0x62,0xc,0,0xc,0,0x40,0x10);
  }
  else {
    sljit_emit_op1(compiler_00,0x20,3,0,0x8c,-0x10);
    sljit_emit_op2(compiler_00,0x62,0xc,0,0xc,0,0x40,0x10);
    sljit_emit_op1(compiler_00,0x20,0x84,0,3,0);
  }
  psVar2 = sljit_emit_jump(compiler_00,0x18);
  sljit_set_label(psVar2,label);
  return;
}

Assistant:

static void do_revertframes(compiler_common *common)
{
DEFINE_COMPILER;
struct sljit_jump *jump;
struct sljit_label *mainloop;

sljit_emit_fast_enter(compiler, RETURN_ADDR, 0);
GET_LOCAL_BASE(TMP1, 0, 0);

/* Drop frames until we reach STACK_TOP. */
mainloop = LABEL();
OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(STACK_TOP), -sizeof(sljit_sw));
jump = CMP(SLJIT_SIG_LESS_EQUAL, TMP2, 0, SLJIT_IMM, 0);

OP2(SLJIT_ADD, TMP2, 0, TMP2, 0, TMP1, 0);
if (sljit_get_register_index (TMP3) < 0)
  {
  OP1(SLJIT_MOV, SLJIT_MEM1(TMP2), 0, SLJIT_MEM1(STACK_TOP), -(2 * sizeof(sljit_sw)));
  OP1(SLJIT_MOV, SLJIT_MEM1(TMP2), sizeof(sljit_sw), SLJIT_MEM1(STACK_TOP), -(3 * sizeof(sljit_sw)));
  OP2(SLJIT_SUB, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, 3 * sizeof(sljit_sw));
  }
else
  {
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), -(2 * sizeof(sljit_sw)));
  OP1(SLJIT_MOV, TMP3, 0, SLJIT_MEM1(STACK_TOP), -(3 * sizeof(sljit_sw)));
  OP2(SLJIT_SUB, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, 3 * sizeof(sljit_sw));
  OP1(SLJIT_MOV, SLJIT_MEM1(TMP2), 0, TMP1, 0);
  GET_LOCAL_BASE(TMP1, 0, 0);
  OP1(SLJIT_MOV, SLJIT_MEM1(TMP2), sizeof(sljit_sw), TMP3, 0);
  }
JUMPTO(SLJIT_JUMP, mainloop);

JUMPHERE(jump);
jump = CMP(SLJIT_NOT_ZERO /* SIG_LESS */, TMP2, 0, SLJIT_IMM, 0);
/* End of reverting values. */
sljit_emit_fast_return(compiler, RETURN_ADDR, 0);

JUMPHERE(jump);
OP1(SLJIT_NEG, TMP2, 0, TMP2, 0);
OP2(SLJIT_ADD, TMP2, 0, TMP2, 0, TMP1, 0);
if (sljit_get_register_index (TMP3) < 0)
  {
  OP1(SLJIT_MOV, SLJIT_MEM1(TMP2), 0, SLJIT_MEM1(STACK_TOP), -(2 * sizeof(sljit_sw)));
  OP2(SLJIT_SUB, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, 2 * sizeof(sljit_sw));
  }
else
  {
  OP1(SLJIT_MOV, TMP3, 0, SLJIT_MEM1(STACK_TOP), -(2 * sizeof(sljit_sw)));
  OP2(SLJIT_SUB, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, 2 * sizeof(sljit_sw));
  OP1(SLJIT_MOV, SLJIT_MEM1(TMP2), 0, TMP3, 0);
  }
JUMPTO(SLJIT_JUMP, mainloop);
}